

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  size_t sVar3;
  float *pfVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  byte bVar21;
  int iVar22;
  float *vertices;
  long lVar23;
  long lVar24;
  byte bVar25;
  size_t i_1;
  long lVar26;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  size_t sVar28;
  ulong uVar29;
  size_t sVar30;
  uint uVar31;
  byte bVar32;
  NodeRef root;
  undefined4 uVar33;
  NodeRef *pNVar34;
  byte bVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 ai_2;
  float fVar53;
  float fVar54;
  float fVar55;
  vint4 bi;
  float fVar56;
  vint4 bi_1;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 ai;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai_1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 ai_3;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar82 [64];
  uint local_1a44;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_19a8 [16];
  BVH *local_1990;
  Intersectors *local_1988;
  long local_1980;
  Scene *local_1978;
  vuint<4> *v;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1968;
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined1 local_1938 [16];
  undefined1 local_1928 [8];
  float fStack_1920;
  float fStack_191c;
  undefined1 local_1918 [8];
  float fStack_1910;
  float fStack_190c;
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  longlong local_18f8;
  longlong lStack_18f0;
  longlong local_18e8;
  longlong lStack_18e0;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  TravRayK<4,_false> tray;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1798;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined1 local_1758 [8];
  float fStack_1750;
  float fStack_174c;
  undefined1 local_1748 [8];
  float fStack_1740;
  float fStack_173c;
  undefined1 local_1738 [16];
  uint local_1728;
  uint uStack_1724;
  uint uStack_1720;
  uint uStack_171c;
  uint uStack_1718;
  uint uStack_1714;
  uint uStack_1710;
  uint uStack_170c;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1990 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1990->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar41 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar50 = ZEXT816(0) << 0x40;
    uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar50,5);
    uVar36 = vpcmpeqd_avx512vl(auVar41,(undefined1  [16])valid_i->field_0);
    uVar36 = ((byte)uVar10 & 0xf) & uVar36;
    bVar35 = (byte)uVar36;
    if (bVar35 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar43._8_4_ = 0x7fffffff;
      auVar43._0_8_ = 0x7fffffff7fffffff;
      auVar43._12_4_ = 0x7fffffff;
      auVar41 = vandps_avx(auVar43,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      uVar29 = vcmpps_avx512vl(auVar41,auVar39,1);
      bVar20 = (bool)((byte)uVar29 & 1);
      auVar40._0_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._0_4_;
      bVar20 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._4_4_;
      bVar20 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._8_4_;
      bVar20 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._12_4_;
      auVar41 = vandps_avx(auVar43,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar29 = vcmpps_avx512vl(auVar41,auVar39,1);
      bVar20 = (bool)((byte)uVar29 & 1);
      auVar37._0_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._16_4_;
      bVar20 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar37._4_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._20_4_;
      bVar20 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar37._8_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._24_4_;
      bVar20 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar37._12_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._28_4_;
      auVar41 = vandps_avx(auVar43,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar29 = vcmpps_avx512vl(auVar41,auVar39,1);
      bVar20 = (bool)((byte)uVar29 & 1);
      auVar38._0_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._32_4_;
      bVar20 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._36_4_;
      bVar20 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._40_4_;
      bVar20 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * tray.dir.field_0._44_4_;
      auVar39 = vrcp14ps_avx512vl(auVar40);
      auVar42._8_4_ = 0x3f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      auVar42._12_4_ = 0x3f800000;
      auVar41 = vfnmadd213ps_fma(auVar40,auVar39,auVar42);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar39,auVar39)
      ;
      auVar40 = vrcp14ps_avx512vl(auVar37);
      auVar41 = vfnmadd213ps_fma(auVar37,auVar40,auVar42);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar40,auVar40)
      ;
      auVar40 = vrcp14ps_avx512vl(auVar38);
      auVar41 = vfnmadd213ps_fma(auVar38,auVar40,auVar42);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar40,auVar40)
      ;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar50,1);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar41._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar29 & 1) * auVar41._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar41._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar41._12_4_;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar50,5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar20 = (bool)((byte)uVar29 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar20 * auVar41._0_4_ | (uint)!bVar20 * 0x30;
      bVar20 = (bool)((byte)(uVar29 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar20 * auVar41._4_4_ | (uint)!bVar20 * 0x30;
      bVar20 = (bool)((byte)(uVar29 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar20 * auVar41._8_4_ | (uint)!bVar20 * 0x30;
      bVar20 = (bool)((byte)(uVar29 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar20 * auVar41._12_4_ | (uint)!bVar20 * 0x30;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar50,5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar20 = (bool)((byte)uVar29 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar20 * auVar41._0_4_ | (uint)!bVar20 * 0x50;
      bVar20 = (bool)((byte)(uVar29 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar20 * auVar41._4_4_ | (uint)!bVar20 * 0x50;
      bVar20 = (bool)((byte)(uVar29 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar20 * auVar41._8_4_ | (uint)!bVar20 * 0x50;
      bVar20 = (bool)((byte)(uVar29 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar20 * auVar41._12_4_ | (uint)!bVar20 * 0x50;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar80 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar50);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar35 & 1) * auVar41._0_4_ |
           (uint)!(bool)(bVar35 & 1) * stack_near[0].field_0._0_4_;
      bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar20 * auVar41._4_4_ | (uint)!bVar20 * stack_near[0].field_0._4_4_;
      bVar20 = (bool)((byte)(uVar36 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar20 * auVar41._8_4_ | (uint)!bVar20 * stack_near[0].field_0._8_4_;
      bVar20 = SUB81(uVar36 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar20 * auVar41._12_4_ | (uint)!bVar20 * stack_near[0].field_0._12_4_;
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar50);
      tray.tfar.field_0.i[0] =
           (uint)(bVar35 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar35 & 1) * -0x800000;
      bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar20 * auVar41._4_4_ | (uint)!bVar20 * -0x800000;
      bVar20 = (bool)((byte)(uVar36 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar20 * auVar41._8_4_ | (uint)!bVar20 * -0x800000;
      bVar20 = SUB81(uVar36 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar20 * auVar41._12_4_ | (uint)!bVar20 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      local_1a44 = (byte)((ushort)((short)uVar36 << 0xc) >> 0xc) ^ 0xf;
      pNVar34 = stack_node + 2;
      paVar27 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar81 = ZEXT1664(auVar41);
      auVar41 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar82 = ZEXT1664(auVar41);
      local_1988 = This;
LAB_01c8a13c:
      do {
        do {
          root.ptr = pNVar34[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c8ab5a;
          pNVar34 = pNVar34 + -1;
          paVar27 = paVar27 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar27->v;
          auVar70 = ZEXT1664((undefined1  [16])vVar2.field_0);
          uVar36 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar36 == '\0');
        uVar33 = (undefined4)uVar36;
        if (uVar31 < (uint)POPCOUNT(uVar33)) {
LAB_01c8a17c:
          do {
            iVar22 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c8ab5a;
              uVar10 = vcmpps_avx512vl(auVar70._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar10 == '\0') goto LAB_01c8a13c;
              local_1980 = (ulong)((uint)root.ptr & 0xf) - 8;
              bVar25 = ~(byte)local_1a44 & 0xf;
              lVar24 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              lVar23 = 0;
              goto LAB_01c8a431;
            }
            sVar30 = 8;
            auVar41 = auVar80._0_16_;
            for (lVar24 = 0;
                (auVar70 = ZEXT1664(auVar41), lVar24 != 4 &&
                (sVar3 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar24 * 8), sVar3 != 8));
                lVar24 = lVar24 + 1) {
              auVar18._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar18._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar18._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar18._12_4_ = tray.org_rdir.field_0._12_4_;
              uVar33 = *(undefined4 *)(root.ptr + 0x20 + lVar24 * 4);
              auVar59._4_4_ = uVar33;
              auVar59._0_4_ = uVar33;
              auVar59._8_4_ = uVar33;
              auVar59._12_4_ = uVar33;
              auVar37 = vfmsub132ps_fma(auVar59,auVar18,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              uVar33 = *(undefined4 *)(root.ptr + 0x40 + lVar24 * 4);
              auVar64._4_4_ = uVar33;
              auVar64._0_4_ = uVar33;
              auVar64._8_4_ = uVar33;
              auVar64._12_4_ = uVar33;
              auVar19._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar19._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar19._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar19._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar33 = *(undefined4 *)(root.ptr + 0x60 + lVar24 * 4);
              auVar66._4_4_ = uVar33;
              auVar66._0_4_ = uVar33;
              auVar66._8_4_ = uVar33;
              auVar66._12_4_ = uVar33;
              auVar38 = vfmsub132ps_fma(auVar64,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.y.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar39 = vfmsub132ps_fma(auVar66,auVar19,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar33 = *(undefined4 *)(root.ptr + 0x30 + lVar24 * 4);
              auVar13._4_4_ = uVar33;
              auVar13._0_4_ = uVar33;
              auVar13._8_4_ = uVar33;
              auVar13._12_4_ = uVar33;
              auVar42 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar18,
                                   auVar13);
              uVar33 = *(undefined4 *)(root.ptr + 0x50 + lVar24 * 4);
              auVar14._4_4_ = uVar33;
              auVar14._0_4_ = uVar33;
              auVar14._8_4_ = uVar33;
              auVar14._12_4_ = uVar33;
              auVar43 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,auVar14
                                  );
              uVar33 = *(undefined4 *)(root.ptr + 0x70 + lVar24 * 4);
              auVar15._4_4_ = uVar33;
              auVar15._0_4_ = uVar33;
              auVar15._8_4_ = uVar33;
              auVar15._12_4_ = uVar33;
              auVar44 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar19,
                                   auVar15);
              auVar50 = vpminsd_avx(auVar37,auVar42);
              auVar40 = vpminsd_avx(auVar38,auVar43);
              auVar50 = vpmaxsd_avx(auVar50,auVar40);
              auVar40 = vpminsd_avx(auVar39,auVar44);
              auVar50 = vpmaxsd_avx(auVar50,auVar40);
              auVar40 = vpmaxsd_avx(auVar37,auVar42);
              auVar37 = vpmaxsd_avx(auVar38,auVar43);
              auVar37 = vpminsd_avx(auVar40,auVar37);
              auVar40 = vpmaxsd_avx(auVar39,auVar44);
              auVar37 = vpminsd_avx(auVar37,auVar40);
              auVar40 = vpmaxsd_avx(auVar50,(undefined1  [16])tray.tnear.field_0);
              auVar37 = vpminsd_avx(auVar37,(undefined1  [16])tray.tfar.field_0);
              uVar36 = vpcmpd_avx512vl(auVar40,auVar37,2);
              uVar36 = uVar36 & 0xf;
              sVar28 = sVar30;
              auVar45 = auVar41;
              if ((byte)uVar36 != 0) {
                auVar40 = vblendmps_avx512vl(auVar80._0_16_,auVar50);
                bVar20 = (bool)((byte)uVar36 & 1);
                auVar45._0_4_ = (uint)bVar20 * auVar40._0_4_ | (uint)!bVar20 * auVar50._0_4_;
                bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar20 * auVar40._4_4_ | (uint)!bVar20 * auVar50._4_4_;
                bVar20 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar20 * auVar40._8_4_ | (uint)!bVar20 * auVar50._8_4_;
                bVar20 = SUB81(uVar36 >> 3,0);
                auVar45._12_4_ = (uint)bVar20 * auVar40._12_4_ | (uint)!bVar20 * auVar50._12_4_;
                sVar28 = sVar3;
                if (sVar30 != 8) {
                  pNVar34->ptr = sVar30;
                  pNVar34 = pNVar34 + 1;
                  *(undefined1 (*) [16])paVar27->v = auVar41;
                  paVar27 = paVar27 + 1;
                }
              }
              auVar41 = auVar45;
              sVar30 = sVar28;
            }
            if (sVar30 == 8) goto LAB_01c8a2df;
            uVar10 = vcmpps_avx512vl(auVar41,(undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar30;
          } while ((byte)uVar31 < (byte)POPCOUNT((int)uVar10));
          pNVar34->ptr = sVar30;
          pNVar34 = pNVar34 + 1;
          *(undefined1 (*) [16])paVar27->v = auVar41;
          paVar27 = paVar27 + 1;
        }
        else {
          while( true ) {
            auVar41 = auVar82._0_16_;
            if (uVar36 == 0) break;
            sVar30 = 0;
            for (uVar29 = uVar36; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
              sVar30 = sVar30 + 1;
            }
            uVar36 = uVar36 - 1 & uVar36;
            bVar20 = occluded1(local_1988,local_1990,root,sVar30,&pre,ray,&tray,context);
            auVar41 = vxorps_avx512vl(auVar41,auVar41);
            auVar82 = ZEXT1664(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar81 = ZEXT1664(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar80 = ZEXT1664(auVar41);
            bVar25 = (byte)(1 << ((uint)sVar30 & 0x1f));
            if (!bVar20) {
              bVar25 = 0;
            }
            local_1a44 = (uint)((byte)local_1a44 | bVar25);
          }
          iVar22 = 3;
          auVar70 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((byte)local_1a44 != 0xf) {
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_1a44 & 1) * auVar41._0_4_ |
                 (uint)!(bool)((byte)local_1a44 & 1) * tray.tfar.field_0.i[0];
            bVar20 = (bool)((byte)(local_1a44 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar20 * auVar41._4_4_ | (uint)!bVar20 * tray.tfar.field_0.i[1];
            bVar20 = (bool)((byte)(local_1a44 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar20 * auVar41._8_4_ | (uint)!bVar20 * tray.tfar.field_0.i[2];
            bVar20 = (bool)((byte)(local_1a44 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar20 * auVar41._12_4_ | (uint)!bVar20 * tray.tfar.field_0.i[3];
            iVar22 = 2;
          }
          if (uVar31 < (uint)POPCOUNT(uVar33)) goto LAB_01c8a17c;
        }
LAB_01c8a2df:
      } while ((iVar22 == 4) || (iVar22 == 2));
LAB_01c8ab5a:
      local_1a44._0_1_ = (byte)local_1a44 & bVar35;
      bVar20 = (bool)((byte)local_1a44 >> 1 & 1);
      bVar7 = (bool)((byte)local_1a44 >> 2 & 1);
      *(uint *)pRVar1 =
           (uint)((byte)local_1a44 & 1) * -0x800000 |
           (uint)!(bool)((byte)local_1a44 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar20 * -0x800000 | (uint)!bVar20 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)((byte)local_1a44 >> 3) * -0x800000 |
           (uint)!(bool)((byte)local_1a44 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
LAB_01c8a431:
  do {
    if (lVar23 == local_1980) goto LAB_01c8ab21;
    v = (vuint<4> *)(lVar23 * 0x50 + (root.ptr & 0xfffffffffffffff0));
    local_1978 = context->scene;
    lVar26 = 0;
    bVar32 = bVar25;
    do {
      if ((lVar26 == 4) || (*(int *)(lVar24 + lVar26 * 4) == -1)) goto LAB_01c8ab0b;
      pfVar4 = (local_1978->vertices).items[*(uint *)(lVar24 + -0x10 + lVar26 * 4)];
      uVar36 = (ulong)*(uint *)(lVar24 + -0x40 + lVar26 * 4);
      fVar53 = pfVar4[uVar36];
      auVar57._4_4_ = fVar53;
      auVar57._0_4_ = fVar53;
      auVar57._8_4_ = fVar53;
      auVar57._12_4_ = fVar53;
      uVar29 = (ulong)*(uint *)(lVar24 + -0x30 + lVar26 * 4);
      fVar54 = pfVar4[uVar36 + 1];
      auVar60._4_4_ = fVar54;
      auVar60._0_4_ = fVar54;
      auVar60._8_4_ = fVar54;
      auVar60._12_4_ = fVar54;
      fVar55 = pfVar4[uVar36 + 2];
      auVar62._4_4_ = fVar55;
      auVar62._0_4_ = fVar55;
      auVar62._8_4_ = fVar55;
      auVar62._12_4_ = fVar55;
      uVar36 = (ulong)*(uint *)(lVar24 + -0x20 + lVar26 * 4);
      fVar8 = fVar53 - pfVar4[uVar29];
      fVar56 = fVar54 - pfVar4[uVar29 + 1];
      fVar9 = fVar55 - pfVar4[uVar29 + 2];
      local_18e8 = v[3].field_0.v[0];
      lStack_18e0 = v[3].field_0.v[1];
      local_18f8 = v[4].field_0.v[0];
      lStack_18f0 = v[4].field_0.v[1];
      auVar65._4_4_ = fVar8;
      auVar65._0_4_ = fVar8;
      auVar65._8_4_ = fVar8;
      auVar65._12_4_ = fVar8;
      auVar67._4_4_ = fVar56;
      auVar67._0_4_ = fVar56;
      auVar67._8_4_ = fVar56;
      auVar67._12_4_ = fVar56;
      auVar49._4_4_ = fVar9;
      auVar49._0_4_ = fVar9;
      auVar49._8_4_ = fVar9;
      auVar49._12_4_ = fVar9;
      fVar53 = pfVar4[uVar36] - fVar53;
      auVar79._4_4_ = fVar53;
      auVar79._0_4_ = fVar53;
      auVar79._8_4_ = fVar53;
      auVar79._12_4_ = fVar53;
      auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar4[uVar36 + 1] - fVar54)));
      auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar4[uVar36 + 2] - fVar55)));
      fVar56 = fVar56 * (pfVar4[uVar36 + 2] - fVar55);
      auVar41._4_4_ = fVar56;
      auVar41._0_4_ = fVar56;
      auVar41._8_4_ = fVar56;
      auVar41._12_4_ = fVar56;
      auVar48 = vfmsub231ps_avx512vl(auVar41,auVar46,auVar49);
      fVar53 = fVar9 * fVar53;
      auVar50._4_4_ = fVar53;
      auVar50._0_4_ = fVar53;
      auVar50._8_4_ = fVar53;
      auVar50._12_4_ = fVar53;
      auVar49 = vfmsub231ps_avx512vl(auVar50,auVar47,auVar65);
      fVar8 = (pfVar4[uVar36 + 1] - fVar54) * fVar8;
      auVar44._4_4_ = fVar8;
      auVar44._0_4_ = fVar8;
      auVar44._8_4_ = fVar8;
      auVar44._12_4_ = fVar8;
      aVar12 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               vfmsub231ps_fma(auVar44,auVar79,auVar67);
      auVar37 = vsubps_avx(auVar57,*(undefined1 (*) [16])ray);
      auVar38 = vsubps_avx(auVar60,*(undefined1 (*) [16])(ray + 0x10));
      auVar39 = vsubps_avx(auVar62,*(undefined1 (*) [16])(ray + 0x20));
      auVar41 = *(undefined1 (*) [16])(ray + 0x40);
      auVar50 = *(undefined1 (*) [16])(ray + 0x50);
      auVar40 = *(undefined1 (*) [16])(ray + 0x60);
      auVar76._0_4_ = auVar50._0_4_ * auVar39._0_4_;
      auVar76._4_4_ = auVar50._4_4_ * auVar39._4_4_;
      auVar76._8_4_ = auVar50._8_4_ * auVar39._8_4_;
      auVar76._12_4_ = auVar50._12_4_ * auVar39._12_4_;
      auVar42 = vfmsub231ps_fma(auVar76,auVar38,auVar40);
      auVar77._0_4_ = auVar40._0_4_ * auVar37._0_4_;
      auVar77._4_4_ = auVar40._4_4_ * auVar37._4_4_;
      auVar77._8_4_ = auVar40._8_4_ * auVar37._8_4_;
      auVar77._12_4_ = auVar40._12_4_ * auVar37._12_4_;
      auVar43 = vfmsub231ps_fma(auVar77,auVar39,auVar41);
      auVar78._0_4_ = auVar41._0_4_ * auVar38._0_4_;
      auVar78._4_4_ = auVar41._4_4_ * auVar38._4_4_;
      auVar78._8_4_ = auVar41._8_4_ * auVar38._8_4_;
      auVar78._12_4_ = auVar41._12_4_ * auVar38._12_4_;
      auVar44 = vfmsub231ps_fma(auVar78,auVar37,auVar50);
      auVar63._0_4_ = aVar12.v[0] * auVar40._0_4_;
      auVar63._4_4_ = aVar12.v[1] * auVar40._4_4_;
      auVar63._8_4_ = aVar12.v[2] * auVar40._8_4_;
      auVar63._12_4_ = aVar12.v[3] * auVar40._12_4_;
      auVar50 = vfmadd231ps_fma(auVar63,auVar49,auVar50);
      auVar41 = vfmadd231ps_fma(auVar50,auVar48,auVar41);
      auVar40 = vandps_avx512vl(auVar41,auVar81._0_16_);
      auVar50 = vmulps_avx512vl(auVar47,auVar44);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar43,auVar46);
      auVar50 = vfmadd231ps_fma(auVar50,auVar42,auVar79);
      uVar72 = auVar40._0_4_;
      auVar46._0_4_ = uVar72 ^ auVar50._0_4_;
      uVar73 = auVar40._4_4_;
      auVar46._4_4_ = uVar73 ^ auVar50._4_4_;
      uVar74 = auVar40._8_4_;
      auVar46._8_4_ = uVar74 ^ auVar50._8_4_;
      uVar75 = auVar40._12_4_;
      auVar46._12_4_ = uVar75 ^ auVar50._12_4_;
      auVar50 = auVar82._0_16_;
      uVar10 = vcmpps_avx512vl(auVar46,auVar50,5);
      bVar21 = (byte)uVar10 & bVar32;
      if (bVar21 == 0) {
LAB_01c8a5d9:
        bVar21 = 0;
      }
      else {
        auVar71._0_4_ = fVar9 * auVar44._0_4_;
        auVar71._4_4_ = fVar9 * auVar44._4_4_;
        auVar71._8_4_ = fVar9 * auVar44._8_4_;
        auVar71._12_4_ = fVar9 * auVar44._12_4_;
        auVar40 = vfmadd213ps_fma(auVar43,auVar67,auVar71);
        auVar40 = vfmadd213ps_fma(auVar42,auVar65,auVar40);
        auVar47._0_4_ = uVar72 ^ auVar40._0_4_;
        auVar47._4_4_ = uVar73 ^ auVar40._4_4_;
        auVar47._8_4_ = uVar74 ^ auVar40._8_4_;
        auVar47._12_4_ = uVar75 ^ auVar40._12_4_;
        uVar10 = vcmpps_avx512vl(auVar47,auVar50,5);
        bVar21 = bVar21 & (byte)uVar10;
        if (bVar21 == 0) goto LAB_01c8a5d9;
        auVar17._8_4_ = 0x7fffffff;
        auVar17._0_8_ = 0x7fffffff7fffffff;
        auVar17._12_4_ = 0x7fffffff;
        auVar42 = vandps_avx512vl(auVar41,auVar17);
        auVar40 = vsubps_avx(auVar42,auVar46);
        uVar10 = vcmpps_avx512vl(auVar40,auVar47,5);
        bVar21 = bVar21 & (byte)uVar10;
        if (bVar21 == 0) goto LAB_01c8a5d9;
        auVar68._0_4_ = auVar39._0_4_ * aVar12.v[0];
        auVar68._4_4_ = auVar39._4_4_ * aVar12.v[1];
        auVar68._8_4_ = auVar39._8_4_ * aVar12.v[2];
        auVar68._12_4_ = auVar39._12_4_ * aVar12.v[3];
        auVar40 = vfmadd213ps_fma(auVar38,auVar49,auVar68);
        auVar40 = vfmadd213ps_fma(auVar37,auVar48,auVar40);
        auVar61._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x30);
        auVar61._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x34);
        auVar61._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x38);
        auVar61._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x3c);
        auVar58._0_4_ = uVar72 ^ auVar40._0_4_;
        auVar58._4_4_ = uVar73 ^ auVar40._4_4_;
        auVar58._8_4_ = uVar74 ^ auVar40._8_4_;
        auVar58._12_4_ = uVar75 ^ auVar40._12_4_;
        auVar69._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x80);
        auVar69._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x84);
        auVar69._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x88);
        auVar69._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x8c);
        uVar10 = vcmpps_avx512vl(auVar58,auVar69,2);
        uVar11 = vcmpps_avx512vl(auVar61,auVar58,1);
        bVar21 = bVar21 & (byte)uVar10 & (byte)uVar11;
        if (bVar21 == 0) {
LAB_01c8ab01:
          bVar21 = 0;
          aVar12 = local_1968;
          auVar49 = local_1958;
          auVar48 = local_1948;
          auVar42 = local_1938;
          auVar58 = _local_1928;
          auVar47 = _local_1918;
          auVar46 = _local_1908;
        }
        else {
          uVar10 = vcmpps_avx512vl(auVar41,ZEXT816(0) << 0x20,4);
          bVar21 = bVar21 & (byte)uVar10;
          if (bVar21 == 0) goto LAB_01c8ab01;
        }
        _local_1908 = auVar46;
        _local_1918 = auVar47;
        _local_1928 = auVar58;
        local_1938 = auVar42;
        local_1948 = auVar48;
        local_1958 = auVar49;
        local_1968 = aVar12;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar80 = ZEXT1664(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar81 = ZEXT1664(auVar41);
        auVar41 = vxorps_avx512vl(auVar50,auVar50);
        auVar82 = ZEXT1664(auVar41);
      }
      auVar41 = auVar82._0_16_;
      pGVar5 = (context->scene->geometries).items[*(uint *)((long)&local_18e8 + lVar26 * 4)].ptr;
      uVar72 = pGVar5->mask;
      auVar48._4_4_ = uVar72;
      auVar48._0_4_ = uVar72;
      auVar48._8_4_ = uVar72;
      auVar48._12_4_ = uVar72;
      uVar10 = vptestmd_avx512vl(auVar48,*(undefined1 (*) [16])(ray + 0x90));
      bVar21 = (byte)uVar10 & 0xf & bVar21;
      uVar36 = (ulong)bVar21;
      if (bVar21 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar50 = vrcp14ps_avx512vl(local_1938);
          auVar16._8_4_ = 0x3f800000;
          auVar16._0_8_ = 0x3f8000003f800000;
          auVar16._12_4_ = 0x3f800000;
          auVar40 = vfnmadd213ps_avx512vl(auVar50,local_1938,auVar16);
          auVar50 = vfmadd132ps_fma(auVar40,auVar50,auVar50);
          fVar53 = auVar50._0_4_;
          fVar54 = auVar50._4_4_;
          fVar55 = auVar50._8_4_;
          fVar56 = auVar50._12_4_;
          local_1798._0_8_ = local_1948._0_8_;
          local_1798._8_8_ = local_1948._8_8_;
          local_1798._16_8_ = local_1958._0_8_;
          local_1798._24_8_ = local_1958._8_8_;
          local_1798.field_0.z.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)local_1968;
          local_1768 = CONCAT44(fVar54 * (float)local_1928._4_4_,fVar53 * (float)local_1928._0_4_);
          uStack_1760 = CONCAT44(fVar56 * fStack_191c,fVar55 * fStack_1920);
          local_1758._4_4_ = fVar54 * (float)local_1918._4_4_;
          local_1758._0_4_ = fVar53 * (float)local_1918._0_4_;
          fStack_1750 = fVar55 * fStack_1910;
          fStack_174c = fVar56 * fStack_190c;
          local_1748._4_4_ = fVar54 * (float)local_1908._4_4_;
          local_1748._0_4_ = fVar53 * (float)local_1908._0_4_;
          fStack_1740 = fVar55 * fStack_1900;
          fStack_173c = fVar56 * fStack_18fc;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v_1;
          args.ray = (RTCRayN *)&u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_1798.field_0);
          local_1738 = vpbroadcastd_avx512vl();
          _local_1748 = vpbroadcastd_avx512vl();
          local_1798._0_8_ = Ng.field_0._0_8_;
          local_1798._8_8_ = Ng.field_0._8_8_;
          local_1798._16_8_ = Ng.field_0._16_8_;
          local_1798._24_8_ = Ng.field_0._24_8_;
          local_1768 = u.field_0._0_8_;
          uStack_1760 = u.field_0._8_8_;
          _local_1758 = v_1.field_0;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_1724 = context->user->instID[0];
          local_1728 = uStack_1724;
          uStack_1720 = uStack_1724;
          uStack_171c = uStack_1724;
          uStack_1718 = context->user->instPrimID[0];
          uStack_1714 = uStack_1718;
          uStack_1710 = uStack_1718;
          uStack_170c = uStack_1718;
          auVar50 = *(undefined1 (*) [16])(ray + 0x80);
          auVar40 = vblendmps_avx512vl(auVar50,(undefined1  [16])t.field_0);
          bVar20 = (bool)(bVar21 >> 1 & 1);
          bVar7 = (bool)(bVar21 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar21 & 1) * auVar40._0_4_ | !(bool)(bVar21 & 1) * uStack_1718;
          *(uint *)(ray + 0x84) = (uint)bVar20 * auVar40._4_4_ | !bVar20 * uStack_1718;
          *(uint *)(ray + 0x88) = (uint)bVar7 * auVar40._8_4_ | !bVar7 * uStack_1718;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar21 >> 3) * auVar40._12_4_ | !(bool)(bVar21 >> 3) * uStack_1718;
          local_19a8 = vpmovm2d_avx512vl(uVar36);
          args.valid = (int *)local_19a8;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1798;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar5->occlusionFilterN)(&args);
          }
          uVar36 = vptestmd_avx512vl(local_19a8,local_19a8);
          if ((uVar36 & 0xf) == 0) {
            uVar36 = 0;
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar80 = ZEXT1664(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar81 = ZEXT1664(auVar40);
            auVar41 = vxorps_avx512vl(auVar41,auVar41);
            auVar82 = ZEXT1664(auVar41);
          }
          else {
            p_Var6 = context->args->filter;
            if (p_Var6 == (RTCFilterFunctionN)0x0) {
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar80 = ZEXT1664(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar81 = ZEXT1664(auVar40);
              auVar41 = vxorps_avx512vl(auVar41,auVar41);
              auVar82 = ZEXT1664(auVar41);
            }
            else {
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar80 = ZEXT1664(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar81 = ZEXT1664(auVar40);
              auVar41 = vxorps_avx512vl(auVar41,auVar41);
              auVar82 = ZEXT1664(auVar41);
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var6)(&args);
                auVar41 = vxorps_avx512vl(auVar41,auVar41);
                auVar82 = ZEXT1664(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar81 = ZEXT1664(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar80 = ZEXT1664(auVar41);
              }
            }
            uVar36 = vptestmd_avx512vl(local_19a8,local_19a8);
            uVar36 = uVar36 & 0xf;
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar20 = (bool)((byte)uVar36 & 1);
            auVar51._0_4_ = (uint)bVar20 * auVar41._0_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x80)
            ;
            bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar20 * auVar41._4_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x84)
            ;
            bVar20 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar20 * auVar41._8_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x88)
            ;
            bVar20 = SUB81(uVar36 >> 3,0);
            auVar51._12_4_ =
                 (uint)bVar20 * auVar41._12_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar51;
          }
          bVar20 = (bool)((byte)uVar36 & 1);
          auVar52._0_4_ = (uint)bVar20 * *(int *)pRVar1 | (uint)!bVar20 * auVar50._0_4_;
          bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar52._4_4_ = (uint)bVar20 * *(int *)(ray + 0x84) | (uint)!bVar20 * auVar50._4_4_;
          bVar20 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar52._8_4_ = (uint)bVar20 * *(int *)(ray + 0x88) | (uint)!bVar20 * auVar50._8_4_;
          bVar20 = SUB81(uVar36 >> 3,0);
          auVar52._12_4_ = (uint)bVar20 * *(int *)(ray + 0x8c) | (uint)!bVar20 * auVar50._12_4_;
          *(undefined1 (*) [16])pRVar1 = auVar52;
        }
        bVar32 = ((byte)uVar36 ^ 0xf) & bVar32;
      }
      lVar26 = lVar26 + 1;
    } while (bVar32 != 0);
    bVar32 = 0;
LAB_01c8ab0b:
    lVar23 = lVar23 + 1;
    lVar24 = lVar24 + 0x50;
    bVar25 = bVar25 & bVar32;
  } while (bVar25 != 0);
  bVar25 = 0;
LAB_01c8ab21:
  bVar25 = ~bVar25 & 0xf | (byte)local_1a44;
  local_1a44 = (uint)bVar25;
  if (bVar25 == 0xf) {
    local_1a44._0_1_ = 0xf;
    goto LAB_01c8ab5a;
  }
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  tray.tfar.field_0.i[0] =
       (uint)(bVar25 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar25 & 1) * tray.tfar.field_0.i[0];
  bVar20 = (bool)(bVar25 >> 1 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar20 * auVar41._4_4_ | (uint)!bVar20 * tray.tfar.field_0.i[1];
  bVar20 = (bool)(bVar25 >> 2 & 1);
  tray.tfar.field_0.i[2] = (uint)bVar20 * auVar41._8_4_ | (uint)!bVar20 * tray.tfar.field_0.i[2];
  bVar20 = (bool)(bVar25 >> 3 & 1);
  tray.tfar.field_0.i[3] = (uint)bVar20 * auVar41._12_4_ | (uint)!bVar20 * tray.tfar.field_0.i[3];
  goto LAB_01c8a13c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }